

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

qlonglong QString::toIntegral_helper(QStringView string,bool *ok,int base)

{
  long lVar1;
  QStringView string_00;
  longlong lVar2;
  int in_ECX;
  bool *in_RDX;
  long in_FS_OFFSET;
  undefined1 in_stack_00000008 [12];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  string_00.m_size._4_4_ = base;
  string_00._0_12_ = in_stack_00000008;
  lVar2 = toIntegral<long_long>(string_00,in_RDX,in_ECX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return lVar2;
  }
  __stack_chk_fail();
}

Assistant:

qlonglong QString::toIntegral_helper(QStringView string, bool *ok, int base)
{
    return toIntegral<qlonglong>(string, ok, base);
}